

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O2

void __thiscall
AddressFixture_Decrement_Test::AddressFixture_Decrement_Test(AddressFixture_Decrement_Test *this)

{
  anon_unknown.dwarf_2b45::AddressFixture::AddressFixture(&this->super_AddressFixture);
  (this->super_AddressFixture).super_Test._vptr_Test = (_func_int **)&PTR__Test_00252048;
  return;
}

Assistant:

TEST_F (AddressFixture, Decrement) {
    {
        // Pre-decrement
        auto a1 = pstore::address{1};
        auto r1 = --a1;
        EXPECT_EQ (pstore::address::null (), a1);
        EXPECT_EQ (pstore::address::null (), r1);
    }
    {
        // Post-decrement
        auto a2 = pstore::address{1};
        auto r2 = a2--;
        EXPECT_EQ (pstore::address::null (), a2);
        EXPECT_EQ ((pstore::address{1}), r2);
    }
}